

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ModuleDeclarationSyntax::ModuleDeclarationSyntax
          (ModuleDeclarationSyntax *this,SyntaxKind kind,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ModuleHeaderSyntax *header,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endmodule,
          NamedBlockClauseSyntax *blockName)

{
  Token TVar1;
  ModuleHeaderSyntax *pMVar2;
  iterator ppMVar3;
  MemberSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  NamedBlockClauseSyntax *local_38;
  NamedBlockClauseSyntax *blockName_local;
  SyntaxList<slang::syntax::MemberSyntax> *members_local;
  ModuleHeaderSyntax *header_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ModuleDeclarationSyntax *pMStack_10;
  SyntaxKind kind_local;
  ModuleDeclarationSyntax *this_local;
  
  TVar1 = endmodule;
  local_38 = blockName;
  blockName_local = (NamedBlockClauseSyntax *)members;
  members_local = (SyntaxList<slang::syntax::MemberSyntax> *)header;
  header_local = (ModuleHeaderSyntax *)attributes;
  attributes_local._4_4_ = kind;
  pMStack_10 = this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,kind,attributes);
  __range2 = members_local;
  not_null<slang::syntax::ModuleHeaderSyntax*>::not_null<slang::syntax::ModuleHeaderSyntax*,void>
            ((not_null<slang::syntax::ModuleHeaderSyntax*> *)&this->header,
             (ModuleHeaderSyntax **)&__range2);
  SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
            (&this->members,(SyntaxList<slang::syntax::MemberSyntax> *)blockName_local);
  (this->endmodule).kind = endmodule.kind;
  (this->endmodule).field_0x2 = endmodule._2_1_;
  (this->endmodule).numFlags = (NumericTokenFlags)endmodule.numFlags.raw;
  (this->endmodule).rawLen = endmodule.rawLen;
  endmodule.info = TVar1.info;
  (this->endmodule).info = endmodule.info;
  this->blockName = local_38;
  pMVar2 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->(&this->header);
  (pMVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(this->members).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar3 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(this->members).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  for (; __end2 != ppMVar3; __end2 = __end2 + 1) {
    ((*__end2)->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  if (this->blockName != (NamedBlockClauseSyntax *)0x0) {
    (this->blockName->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

ModuleDeclarationSyntax(SyntaxKind kind, const SyntaxList<AttributeInstanceSyntax>& attributes, ModuleHeaderSyntax& header, const SyntaxList<MemberSyntax>& members, Token endmodule, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(kind, attributes), header(&header), members(members), endmodule(endmodule), blockName(blockName) {
        this->header->parent = this;
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }